

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O3

void __thiscall
btGeneric6DofConstraint::btGeneric6DofConstraint
          (btGeneric6DofConstraint *this,btRigidBody *rbB,btTransform *frameInB,
          bool useLinearReferenceFrameB)

{
  undefined8 *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  btRigidBody *rbA;
  long lVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  
  rbA = btTypedConstraint::getFixedBody();
  btTypedConstraint::btTypedConstraint(&this->super_btTypedConstraint,D6_CONSTRAINT_TYPE,rbA,rbB);
  (this->super_btTypedConstraint)._vptr_btTypedConstraint =
       (_func_int **)&PTR__btTypedConstraint_00220158;
  uVar18 = *(undefined8 *)((frameInB->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_basis.m_el[0].m_floats =
       *(undefined8 *)(frameInB->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_frameInB).m_basis.m_el[0].m_floats + 2) = uVar18;
  uVar18 = *(undefined8 *)((frameInB->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_basis.m_el[1].m_floats =
       *(undefined8 *)(frameInB->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_frameInB).m_basis.m_el[1].m_floats + 2) = uVar18;
  uVar18 = *(undefined8 *)((frameInB->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_basis.m_el[2].m_floats =
       *(undefined8 *)(frameInB->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_frameInB).m_basis.m_el[2].m_floats + 2) = uVar18;
  uVar18 = *(undefined8 *)((frameInB->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_origin.m_floats = *(undefined8 *)(frameInB->m_origin).m_floats
  ;
  *(undefined8 *)((this->m_frameInB).m_origin.m_floats + 2) = uVar18;
  (this->m_linearLimits).m_lowerLimit.m_floats[0] = 0.0;
  (this->m_linearLimits).m_lowerLimit.m_floats[1] = 0.0;
  (this->m_linearLimits).m_lowerLimit.m_floats[2] = 0.0;
  (this->m_linearLimits).m_lowerLimit.m_floats[3] = 0.0;
  (this->m_linearLimits).m_upperLimit.m_floats[0] = 0.0;
  (this->m_linearLimits).m_upperLimit.m_floats[1] = 0.0;
  (this->m_linearLimits).m_upperLimit.m_floats[2] = 0.0;
  (this->m_linearLimits).m_upperLimit.m_floats[3] = 0.0;
  (this->m_linearLimits).m_accumulatedImpulse.m_floats[0] = 0.0;
  (this->m_linearLimits).m_accumulatedImpulse.m_floats[1] = 0.0;
  (this->m_linearLimits).m_accumulatedImpulse.m_floats[2] = 0.0;
  (this->m_linearLimits).m_accumulatedImpulse.m_floats[3] = 0.0;
  (this->m_linearLimits).m_normalCFM.m_floats[0] = 0.0;
  (this->m_linearLimits).m_normalCFM.m_floats[1] = 0.0;
  (this->m_linearLimits).m_normalCFM.m_floats[2] = 0.0;
  (this->m_linearLimits).m_normalCFM.m_floats[3] = 0.0;
  (this->m_linearLimits).m_stopERP.m_floats[0] = 0.2;
  (this->m_linearLimits).m_stopERP.m_floats[1] = 0.2;
  (this->m_linearLimits).m_stopERP.m_floats[2] = 0.2;
  *(undefined8 *)((this->m_linearLimits).m_stopERP.m_floats + 3) = 0;
  (this->m_linearLimits).m_stopCFM.m_floats[1] = 0.0;
  (this->m_linearLimits).m_stopCFM.m_floats[2] = 0.0;
  (this->m_linearLimits).m_stopCFM.m_floats[3] = 0.0;
  (this->m_linearLimits).m_limitSoftness = 0.7;
  (this->m_linearLimits).m_damping = 1.0;
  (this->m_linearLimits).m_restitution = 0.5;
  (this->m_linearLimits).m_enableMotor[0] = false;
  (this->m_linearLimits).m_enableMotor[1] = false;
  (this->m_linearLimits).m_enableMotor[2] = false;
  (this->m_linearLimits).m_targetVelocity.m_floats[2] = 0.0;
  (this->m_linearLimits).m_targetVelocity.m_floats[0] = 0.0;
  (this->m_linearLimits).m_targetVelocity.m_floats[1] = 0.0;
  (this->m_linearLimits).m_maxMotorForce.m_floats[2] = 0.0;
  (this->m_linearLimits).m_maxMotorForce.m_floats[0] = 0.0;
  (this->m_linearLimits).m_maxMotorForce.m_floats[1] = 0.0;
  lVar22 = 0x3b8;
  do {
    puVar1 = (undefined8 *)((long)this + lVar22 + -0x3c);
    *puVar1 = 0xbf8000003f800000;
    puVar1[1] = 0x3dcccccd00000000;
    *(undefined8 *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar22 + -100) = 0x3e4ccccd;
    *(undefined4 *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar22 + -0x5c) = 0;
    puVar1 = (undefined8 *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar22 + -0x74);
    *puVar1 = 0x3f80000043960000;
    puVar1[1] = 0x3f000000;
    *(undefined8 *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar22 + -0x4c) = 0;
    *(undefined4 *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar22 + -0x54) = 0;
    *(undefined1 *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar22 + -0x58) = 0;
    lVar22 = lVar22 + 0x40;
  } while (lVar22 != 0x478);
  this->m_useLinearReferenceFrameA = useLinearReferenceFrameB;
  this->m_useOffsetForConstraintFrame = true;
  this->m_flags = 0;
  this->m_useSolveConstraintObsolete = false;
  fVar2 = (rbB->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0];
  fVar3 = (rbB->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
  fVar4 = (rbB->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
  fVar5 = (this->m_frameInB).m_basis.m_el[0].m_floats[2];
  fVar6 = (this->m_frameInB).m_basis.m_el[1].m_floats[2];
  fVar7 = (this->m_frameInB).m_basis.m_el[2].m_floats[2];
  fVar8 = (rbB->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
  fVar9 = (rbB->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
  fVar10 = (rbB->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
  fVar11 = (rbB->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
  fVar12 = (rbB->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
  fVar13 = (rbB->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
  fVar14 = (this->m_frameInB).m_origin.m_floats[0];
  fVar15 = (this->m_frameInB).m_origin.m_floats[1];
  fVar16 = (this->m_frameInB).m_origin.m_floats[2];
  uVar18 = *(undefined8 *)(rbB->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
  fVar17 = (rbB->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
  uVar19 = *(undefined8 *)(this->m_frameInB).m_basis.m_el[0].m_floats;
  uVar20 = *(undefined8 *)(this->m_frameInB).m_basis.m_el[1].m_floats;
  fVar27 = (float)uVar20;
  fVar28 = (float)((ulong)uVar20 >> 0x20);
  fVar25 = (float)uVar19;
  fVar26 = (float)((ulong)uVar19 >> 0x20);
  uVar19 = *(undefined8 *)(this->m_frameInB).m_basis.m_el[2].m_floats;
  fVar23 = (float)uVar19;
  fVar24 = (float)((ulong)uVar19 >> 0x20);
  *(ulong *)(this->m_frameInA).m_basis.m_el[0].m_floats =
       CONCAT44(fVar4 * fVar24 + fVar2 * fVar26 + fVar3 * fVar28,
                fVar4 * fVar23 + fVar2 * fVar25 + fVar3 * fVar27);
  (this->m_frameInA).m_basis.m_el[0].m_floats[2] = fVar7 * fVar4 + fVar5 * fVar2 + fVar3 * fVar6;
  (this->m_frameInA).m_basis.m_el[0].m_floats[3] = 0.0;
  *(ulong *)(this->m_frameInA).m_basis.m_el[1].m_floats =
       CONCAT44(fVar10 * fVar24 + fVar8 * fVar26 + fVar9 * fVar28,
                fVar10 * fVar23 + fVar8 * fVar25 + fVar9 * fVar27);
  (this->m_frameInA).m_basis.m_el[1].m_floats[2] = fVar7 * fVar10 + fVar5 * fVar8 + fVar6 * fVar9;
  (this->m_frameInA).m_basis.m_el[1].m_floats[3] = 0.0;
  *(ulong *)(this->m_frameInA).m_basis.m_el[2].m_floats =
       CONCAT44(fVar13 * fVar24 + fVar11 * fVar26 + fVar12 * fVar28,
                fVar13 * fVar23 + fVar11 * fVar25 + fVar12 * fVar27);
  (this->m_frameInA).m_basis.m_el[2].m_floats[2] = fVar7 * fVar13 + fVar5 * fVar11 + fVar6 * fVar12;
  (this->m_frameInA).m_basis.m_el[2].m_floats[3] = 0.0;
  auVar21._4_4_ = (float)((ulong)uVar18 >> 0x20) + fVar10 * fVar16 + fVar8 * fVar14 + fVar15 * fVar9
  ;
  auVar21._0_4_ = (float)uVar18 + fVar4 * fVar16 + fVar2 * fVar14 + fVar15 * fVar3;
  auVar21._8_4_ = fVar16 * fVar13 + fVar14 * fVar11 + fVar12 * fVar15 + fVar17;
  auVar21._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_frameInA).m_origin.m_floats = auVar21;
  calculateTransforms(this,&(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).
                            m_worldTransform,
                      &(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).
                       m_worldTransform);
  return;
}

Assistant:

btGeneric6DofConstraint::btGeneric6DofConstraint(btRigidBody& rbB, const btTransform& frameInB, bool useLinearReferenceFrameB)
        : btTypedConstraint(D6_CONSTRAINT_TYPE, getFixedBody(), rbB),
		m_frameInB(frameInB),
		m_useLinearReferenceFrameA(useLinearReferenceFrameB),
		m_useOffsetForConstraintFrame(D6_USE_FRAME_OFFSET),
		m_flags(0),
		m_useSolveConstraintObsolete(false)
{
	///not providing rigidbody A means implicitly using worldspace for body A
	m_frameInA = rbB.getCenterOfMassTransform() * m_frameInB;
	calculateTransforms();
}